

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointTest.cpp
# Opt level: O0

void __thiscall PointAddition::test_method(PointAddition *this)

{
  undefined8 uVar1;
  bool bVar2;
  lazy_ostream *prev;
  basic_cstring<const_char> local_430;
  basic_cstring<const_char> local_420;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_410;
  double local_3f0;
  int local_3e4;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  local_3e0;
  DenseBase<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>> local_3b8 [24];
  assertion_result local_3a0;
  basic_cstring<const_char> local_388;
  basic_cstring<const_char> local_378;
  Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> local_368;
  Point local_340 [296];
  Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> local_218;
  Ref local_1f0 [8];
  Point x;
  Scalar local_b8;
  Scalar local_b0;
  Scalar local_a8;
  undefined1 local_a0 [8];
  Vector3d v;
  RealSpace R3;
  PointAddition *this_local;
  
  mnf::RealSpace::RealSpace
            ((RealSpace *)
             (v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             + 2),3);
  local_a8 = 1.0;
  local_b0 = 2.0;
  local_b8 = 3.0;
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<double,_3,_1,_0,_3,_1> *)local_a0,&local_a8,&local_b0,&local_b8);
  Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::InnerStride<1>>::
  Ref<Eigen::Matrix<double,3,1,0,3,1>>
            ((Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>> *)&local_218,
             (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_a0,(type *)0x0);
  mnf::Manifold::createPoint(local_1f0);
  Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>::~Ref
            (&local_218);
  Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::InnerStride<1>>::
  Ref<Eigen::Matrix<double,3,1,0,3,1>>
            ((Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>> *)&local_368,
             (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_a0,(type *)0x0);
  mnf::operator+(local_340,local_1f0);
  mnf::Point::operator=((Point *)local_1f0,local_340);
  mnf::Point::~Point(local_340);
  Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>::~Ref
            (&local_368);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_378,
               "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/PointTest.cpp"
               ,0x6a);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_388);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_378,100,&local_388);
    mnf::SubPoint::value();
    local_3e4 = 2;
    Eigen::operator*(&local_3e0,&local_3e4,(StorageBaseType *)local_a0);
    local_3f0 = Eigen::NumTraits<double>::dummy_precision();
    bVar2 = Eigen::DenseBase<Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::InnerStride<1>>>
            ::
            isApprox<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>>
                      (local_3b8,
                       (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                        *)&local_3e0,&local_3f0);
    boost::test_tools::assertion_result::assertion_result(&local_3a0,bVar2);
    prev = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_420,"x.value().isApprox(2 * v)",0x19);
    boost::unit_test::operator<<(&local_410,prev,&local_420);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_430,
               "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/PointTest.cpp"
               ,0x6a);
    boost::test_tools::tt_detail::report_assertion(&local_3a0,&local_410,&local_430,100,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_410);
    boost::test_tools::assertion_result::~assertion_result(&local_3a0);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  mnf::Point::~Point((Point *)local_1f0);
  mnf::RealSpace::~RealSpace
            ((RealSpace *)
             (v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             + 2));
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(PointAddition)
{
  RealSpace R3(3);
  Eigen::Vector3d v(1, 2, 3);

  Point x = R3.createPoint(v);
  x = x + v;
  BOOST_CHECK(x.value().isApprox(2 * v));
}